

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O2

void __thiscall
cpptrace::system_error::system_error
          (system_error *this,int error_code,string *message_arg,raw_trace *trace)

{
  error_category *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_68,message_arg,": ");
  peVar1 = (error_category *)std::_V2::generic_category();
  (**(code **)(*(long *)peVar1 + 0x20))(&bStack_88,peVar1,error_code);
  std::operator+(&local_48,&local_68,&bStack_88);
  runtime_error::runtime_error(&this->super_runtime_error,&local_48,trace);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_runtime_error).super_exception_with_message.super_lazy_exception.super_exception =
       (exception)&PTR__exception_with_message_001da640;
  (this->ec)._M_value = error_code;
  (this->ec)._M_cat = peVar1;
  return;
}

Assistant:

system_error::system_error(int error_code, std::string&& message_arg, raw_trace&& trace) noexcept
        : runtime_error(
            message_arg + ": " + std::error_code(error_code, std::generic_category()).message(),
            std::move(trace)
          ),
          ec(std::error_code(error_code, std::generic_category())) {}